

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall
ComponentManager::CreateInstance(ComponentManager *this,CID cid,IID iid,void **object)

{
  int iVar1;
  ErrorCode EVar2;
  long *in_RAX;
  IFactory *factory;
  long *local_28;
  
  local_28 = in_RAX;
  iVar1 = (*(this->super_IComponentManager).super_ISupports._vptr_ISupports[10])
                    (this,cid.mId,"IFactory",&local_28);
  EVar2 = kNoFactory;
  if (iVar1 == 0) {
    EVar2 = (**(code **)(*local_28 + 0x28))(local_28,cid.mId,iid.mId,object);
    (**(code **)(*local_28 + 8))();
  }
  return EVar2;
}

Assistant:

ErrorCode ComponentManager::CreateInstance( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;	
	IFactory *factory;
	
	result = GetService( cid, IFactory::getIID(), (void**)&factory );
	
	LOG( "GetService result %d", result );
	
	if ( result == kNoError )
	{
		result = factory->CreateInstance( cid, iid, object );
		factory->Release();
	}
	else
		result = kNoFactory;

	return result;	
}